

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int lws_parse_numeric_address(char *ads,uint8_t *result,size_t max_len)

{
  char cVar1;
  size_t sVar2;
  lws_tokenize_elem lVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  char t [5];
  lws_tokenize ts;
  uint8_t temp [16];
  
  pcVar5 = strchr(ads,0x3a);
  bVar12 = pcVar5 != (char *)0x0;
  lws_tokenize_init(&ts,ads,0x41);
  ts.len = strlen(ads);
  if (ts.len < 7 && !bVar12) {
LAB_0013525c:
    iVar10 = -1;
  }
  else if (pcVar5 == (char *)0x0 || 1 < ts.len) {
    if (max_len < 4 && pcVar5 == (char *)0x0) {
      iVar10 = -3;
    }
    else if (max_len < 0x10 && pcVar5 != (char *)0x0) {
      iVar10 = -4;
    }
    else {
      if (pcVar5 != (char *)0x0) {
        memset(result,0,max_len);
      }
      iVar4 = 0;
      iVar11 = -1;
      iVar10 = 0;
      puVar8 = result;
      do {
        lVar3 = lws_tokenize(&ts);
        sVar2 = ts.token_len;
        ts.e = (int8_t)lVar3;
        iVar9 = (int)result;
        if (ts.e == '\x01') {
          if (iVar10 == 0) {
            if (bVar12) {
              if (((result[2] == 0xff) && (result[3] == 0xff)) && (iVar11 == 2)) {
                iVar4 = 0;
                memset(result,0,max_len);
                result[10] = 0xff;
                result[0xb] = 0xff;
                bVar12 = false;
                iVar11 = -1;
                iVar10 = 1;
                puVar8 = result + 0xc;
              }
              else {
                iVar10 = 1;
                bVar12 = true;
                if (*ts.token != ':') {
                  return -10;
                }
              }
            }
            else {
              bVar12 = false;
              iVar10 = 1;
              if (*ts.token != '.') {
                return -0xb;
              }
            }
          }
          else {
            if (1 < iVar10) {
              return -8;
            }
            if (*ts.token != ':') {
              return -9;
            }
            puVar8[0] = '\0';
            puVar8[1] = '\0';
            iVar10 = iVar10 + 1;
            iVar11 = (int)(puVar8 + 2) - iVar9;
            puVar8 = puVar8 + 2;
          }
        }
        else {
          if (ts.e != '\x02') {
            if (ts.e != '\0') {
              _lws_log(1,"%s: malformed ip address\n","lws_parse_numeric_address");
              return -0xd;
            }
            if ((iVar4 == 4 && !bVar12) || (iVar4 == 8 && bVar12)) {
              return (int)puVar8 - iVar9;
            }
            if (iVar11 == -1) {
              return -0xc;
            }
            iVar9 = (int)puVar8 - iVar9;
            if (iVar9 == 0x10) {
              return 0x10;
            }
            iVar9 = iVar9 - iVar11;
            memcpy(temp,result + iVar11,(long)iVar9);
            memset(result + iVar11,0,(long)(0x10 - iVar11));
            memcpy(result + (0x10 - iVar9),temp,(long)iVar9);
            return 0x10;
          }
          if (bVar12) {
            if (4 < ts.token_len) goto LAB_0013525c;
            memcpy(t,ts.token,ts.token_len);
            t[sVar2] = '\0';
            sVar6 = 0;
            while (sVar2 != sVar6) {
              cVar1 = t[sVar6];
              if ((((byte)(cVar1 + 0x99U) < 0xc9) || ((byte)(cVar1 - 0x3aU) < 7)) ||
                 (sVar6 = sVar6 + 1, (byte)(cVar1 + 0xb9U) < 0x1a)) goto LAB_0013525c;
            }
            lVar7 = strtol(t,(char **)0x0,0x10);
            if (0xffff < lVar7) {
              return -5;
            }
            *puVar8 = (uint8_t)((ulong)lVar7 >> 8);
            puVar8 = puVar8 + 1;
          }
          else {
            if (3 < ts.token_len) goto LAB_0013525c;
            memcpy(t,ts.token,ts.token_len);
            t[sVar2] = '\0';
            sVar6 = 0;
            while (sVar2 != sVar6) {
              pcVar5 = t + sVar6;
              sVar6 = sVar6 + 1;
              if ((byte)(*pcVar5 - 0x3aU) < 0xf6) goto LAB_0013525c;
            }
            lVar7 = strtol(t,(char **)0x0,10);
            if (0xff < lVar7) {
              return -6;
            }
          }
          if (lVar7 < 0) {
            return -7;
          }
          *puVar8 = (uint8_t)lVar7;
          iVar4 = iVar4 + 1;
          iVar10 = 0;
          puVar8 = puVar8 + 1;
        }
      } while (('\0' < ts.e) && ((long)puVar8 - (long)result <= (long)(int)max_len));
      _lws_log(1,"%s: ended on e %d\n","lws_parse_numeric_address");
      iVar10 = -0xe;
    }
  }
  else {
    iVar10 = -2;
  }
  return iVar10;
}

Assistant:

int
lws_parse_numeric_address(const char *ads, uint8_t *result, size_t max_len)
{
	struct lws_tokenize ts;
	uint8_t *orig = result, temp[16];
	int sects = 0, ipv6 = !!strchr(ads, ':'), skip_point = -1, dm = 0;
	char t[5];
	size_t n;
	long u;

	lws_tokenize_init(&ts, ads, LWS_TOKENIZE_F_NO_INTEGERS |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	ts.len = strlen(ads);
	if (!ipv6 && ts.len < 7)
		return -1;

	if (ipv6 && ts.len < 2)
		return -2;

	if (!ipv6 && max_len < 4)
		return -3;

	if (ipv6 && max_len < 16)
		return -4;

	if (ipv6)
		memset(result, 0, max_len);

	do {
		ts.e = lws_tokenize(&ts);
		switch (ts.e) {
		case LWS_TOKZE_TOKEN:
			dm = 0;
			if (ipv6) {
				if (ts.token_len > 4)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > 'f' ||
					    (t[n] > '9' && t[n] < 'A') ||
					    (t[n] > 'F' && t[n] < 'a'))
						return -1;
				u = strtol(t, NULL, 16);
				if (u > 0xffff)
					return -5;
				*result++ = (uint8_t)(u >> 8);
			} else {
				if (ts.token_len > 3)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > '9')
						return -1;
				u = strtol(t, NULL, 10);
				if (u > 0xff)
					return -6;
			}
			if (u < 0)
				return -7;
			*result++ = (uint8_t)u;
			sects++;
			break;

		case LWS_TOKZE_DELIMITER:
			if (dm++) {
				if (dm > 2)
					return -8;
				if (*ts.token != ':')
					return -9;
				/* back to back : */
				*result++ = 0;
				*result++ = 0;
				skip_point = lws_ptr_diff(result, orig);
				break;
			}
			if (ipv6 && orig[2] == 0xff && orig[3] == 0xff &&
			    skip_point == 2) {
				/* ipv4 backwards compatible format */
				ipv6 = 0;
				memset(orig, 0, max_len);
				orig[10] = 0xff;
				orig[11] = 0xff;
				skip_point = -1;
				result = &orig[12];
				sects = 0;
				break;
			}
			if (ipv6 && *ts.token != ':')
				return -10;
			if (!ipv6 && *ts.token != '.')
				return -11;
			break;

		case LWS_TOKZE_ENDED:
			if (!ipv6 && sects == 4)
				return lws_ptr_diff(result, orig);
			if (ipv6 && sects == 8)
				return lws_ptr_diff(result, orig);
			if (skip_point != -1) {
				int ow = lws_ptr_diff(result, orig);
				/*
				 * contains ...::...
				 */
				if (ow == 16)
					return 16;
				memcpy(temp, &orig[skip_point], ow - skip_point);
				memset(&orig[skip_point], 0, 16 - skip_point);
				memcpy(&orig[16 - (ow - skip_point)], temp,
						   ow - skip_point);

				return 16;
			}
			return -12;

		default: /* includes ENDED */
			lwsl_err("%s: malformed ip address\n",
				 __func__);

			return -13;
		}
	} while (ts.e > 0 && result - orig <= (int)max_len);

	lwsl_err("%s: ended on e %d\n", __func__, ts.e);

	return -14;
}